

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O2

int copy_file_data_block(bsdtar *bsdtar,archive *a,archive *in_a,archive_entry *entry)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  long progress;
  size_t s;
  ulong uVar4;
  size_t bytes_read;
  void *buff;
  int64_t offset;
  archive *local_38;
  
  progress = 0;
  pcVar3 = (char *)0x0;
  local_38 = in_a;
LAB_001100b8:
  iVar1 = archive_read_data_block(local_38,&buff,&bytes_read,&offset);
  if (iVar1 == 0) {
    iVar1 = need_report();
    if (iVar1 != 0) {
      report_write(bsdtar,a,entry,progress);
    }
    uVar4 = offset - progress;
    if (uVar4 != 0 && progress <= offset) {
      if (pcVar3 == (char *)0x0) {
        pcVar3 = bsdtar->buff;
        memset(pcVar3,0,bsdtar->buff_size);
      }
      for (; 0 < (long)uVar4; uVar4 = uVar4 - uVar2) {
        s = bsdtar->buff_size;
        if ((long)uVar4 < (long)bsdtar->buff_size) {
          s = uVar4;
        }
        uVar2 = archive_write_data(a,pcVar3,s);
        if ((long)uVar2 < 0) goto LAB_00110199;
        if (uVar2 < s) goto LAB_00110179;
        progress = progress + uVar2;
      }
    }
    uVar4 = archive_write_data(a,buff,bytes_read);
    if (-1 < (long)uVar4) goto code_r0x0011016b;
LAB_00110199:
    pcVar3 = archive_error_string(a);
    iVar1 = 0;
  }
  else {
    if (-0x15 < iVar1) {
      return 0;
    }
    iVar1 = archive_errno(a);
    pcVar3 = archive_error_string(a);
  }
  lafe_warnc(iVar1,"%s",pcVar3);
  return -1;
code_r0x0011016b:
  progress = progress + uVar4;
  if (uVar4 < bytes_read) {
LAB_00110179:
    pcVar3 = archive_entry_pathname(entry);
    lafe_warnc(0,"%s: Truncated write; file may have grown while being archived.",pcVar3);
    return 0;
  }
  goto LAB_001100b8;
}

Assistant:

static int
copy_file_data_block(struct bsdtar *bsdtar, struct archive *a,
    struct archive *in_a, struct archive_entry *entry)
{
	size_t	bytes_read;
	ssize_t	bytes_written;
	int64_t	offset, progress = 0;
	char *null_buff = NULL;
	const void *buff;
	int r;

	while ((r = archive_read_data_block(in_a, &buff,
	    &bytes_read, &offset)) == ARCHIVE_OK) {
		if (need_report())
			report_write(bsdtar, a, entry, progress);

		if (offset > progress) {
			int64_t sparse = offset - progress;
			size_t ns;

			if (null_buff == NULL) {
				null_buff = bsdtar->buff;
				memset(null_buff, 0, bsdtar->buff_size);
			}

			while (sparse > 0) {
				if (sparse > (int64_t)bsdtar->buff_size)
					ns = bsdtar->buff_size;
				else
					ns = (size_t)sparse;
				bytes_written =
				    archive_write_data(a, null_buff, ns);
				if (bytes_written < 0) {
					/* Write failed; this is bad */
					lafe_warnc(0, "%s",
					     archive_error_string(a));
					return (-1);
				}
				if ((size_t)bytes_written < ns) {
					/* Write was truncated; warn but
					 * continue. */
					lafe_warnc(0,
					    "%s: Truncated write; file may "
					    "have grown while being archived.",
					    archive_entry_pathname(entry));
					return (0);
				}
				progress += bytes_written;
				sparse -= bytes_written;
			}
		}

		bytes_written = archive_write_data(a, buff, bytes_read);
		if (bytes_written < 0) {
			/* Write failed; this is bad */
			lafe_warnc(0, "%s", archive_error_string(a));
			return (-1);
		}
		if ((size_t)bytes_written < bytes_read) {
			/* Write was truncated; warn but continue. */
			lafe_warnc(0,
			    "%s: Truncated write; file may have grown "
			    "while being archived.",
			    archive_entry_pathname(entry));
			return (0);
		}
		progress += bytes_written;
	}
	if (r < ARCHIVE_WARN) {
		lafe_warnc(archive_errno(a), "%s", archive_error_string(a));
		return (-1);
	}
	return (0);
}